

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypeParser.cpp
# Opt level: O2

BondType * __thiscall
OpenMD::BondTypeParser::parseLine(BondTypeParser *this,string *line,RealType kScale)

{
  uint uVar1;
  BondTypeEnum BVar2;
  int iVar3;
  int myMatt;
  PolynomialBondType *this_00;
  _Rb_tree_header *p_Var4;
  ShiftedMieBondType *this_01;
  OpenMDException *pOVar5;
  bool bVar6;
  RealType RVar7;
  allocator<char> local_d1;
  RealType local_d0;
  RealType local_c8;
  string local_c0;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  StringTokenizer tokenizer;
  
  local_d0 = kScale;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0," ;\t\n\r",&local_d1);
  StringTokenizer::StringTokenizer(&tokenizer,line,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  uVar1 = StringTokenizer::countTokens(&tokenizer);
  if ((int)uVar1 < 1) {
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
    OpenMDException::OpenMDException(pOVar5,&local_c0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_c0,&tokenizer);
  BVar2 = getBondTypeEnum(this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  switch(BVar2) {
  case btFixed:
    if (uVar1 == 1) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x10);
    (this_01->super_BondType).r0 = local_d0;
    (this_01->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002bffe0;
    break;
  case btHarmonic:
    if (uVar1 < 3) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x18);
    (this_01->super_BondType).r0 = local_c8;
    (this_01->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002bfd60;
    this_01->sigma = local_a0 * local_d0;
    break;
  case btCubic:
    if (uVar1 < 6) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_90 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x30);
    (this_01->super_BondType).r0 = local_d0;
    (this_01->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002c0008;
    this_01->sigma = local_c8;
    this_01->epsilon = local_a0;
    *(RealType *)&this_01->n = local_90;
    this_01->nmScale_ = local_98;
    break;
  case btQuartic:
    if (uVar1 < 7) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_90 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_98 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x38);
    (this_01->super_BondType).r0 = local_d0;
    (this_01->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002c0048;
    this_01->sigma = local_c8;
    this_01->epsilon = local_a0;
    *(RealType *)&this_01->n = local_90;
    this_01->nmScale_ = local_98;
    this_01->rS_ = RVar7;
    break;
  case btPolynomial:
    if ((uVar1 < 4) || ((uVar1 & 1) != 0)) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (PolynomialBondType *)operator_new(0x40);
    (this_00->super_BondType).r0 = local_d0;
    (this_00->super_BondType)._vptr_BondType = (_func_int **)&PTR__PolynomialBondType_002c0088;
    p_Var4 = &(this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
    (this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var4->_M_header;
    (this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var4->_M_header;
    (this_00->polynomial_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar1 = uVar1 - 2 >> 1;
    this_01 = (ShiftedMieBondType *)0x0;
    while (bVar6 = uVar1 != 0, uVar1 = uVar1 - 1, bVar6) {
      iVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
      RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      PolynomialBondType::setCoefficient(this_00,iVar3,RVar7);
    }
    break;
  case btMorse:
    if (uVar1 < 4) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_a0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x20);
    (this_01->super_BondType).r0 = local_d0;
    (this_01->super_BondType)._vptr_BondType = (_func_int **)&PTR__BondType_002c00c8;
    this_01->sigma = local_c8;
    this_01->epsilon = local_a0;
    break;
  case btShiftedMie:
    if (uVar1 < 5) {
      pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"BondTypeParser: Not enough tokens",&local_d1);
      OpenMDException::OpenMDException(pOVar5,&local_c0);
      __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_d0 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    local_c8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    iVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
    myMatt = StringTokenizer::nextTokenAsInt(&tokenizer);
    this_01 = (ShiftedMieBondType *)operator_new(0x40);
    ShiftedMieBondType::ShiftedMieBondType(this_01,local_d0,local_c8,iVar3,myMatt);
    break;
  default:
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"BondTypeParser: Unknown Bond Type",&local_d1);
    OpenMDException::OpenMDException(pOVar5,&local_c0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return &this_01->super_BondType;
}

Assistant:

BondType* BondTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("BondTypeParser: Not enough tokens");
    }

    BondTypeEnum bt = getBondTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    switch (bt) {
    case btFixed:
      if (nTokens < 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        bondType    = new FixedBondType(b0);
      }
      break;

    case btHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType kb = tokenizer.nextTokenAsDouble();
        kb *= kScale;
        bondType = new HarmonicBondType(b0, kb);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new CubicBondType(b0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new QuarticBondType(b0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial:

      if (nTokens < 3 || nTokens % 2 != 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBondType* pbt = new PolynomialBondType(b0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }

      break;

    case btMorse:
      if (nTokens < 3) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0   = tokenizer.nextTokenAsDouble();
        RealType D    = tokenizer.nextTokenAsDouble();
        RealType beta = tokenizer.nextTokenAsDouble();
        bondType      = new MorseBondType(b0, D, beta);
      }
      break;

    case btShiftedMie:
      if (nTokens < 4) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();

        bondType = new ShiftedMieBondType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BondTypeParser: Unknown Bond Type");
    }

    return bondType;
  }